

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symmetric_difference_iterator.hpp
# Opt level: O3

symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
* __thiscall
burst::
make_symmetric_difference_iterator<std::forward_list<int,std::allocator<int>>const,std::__cxx11::list<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::deque<int,std::allocator<int>>const,std::greater<void>>
          (symmetric_difference_iterator<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_std::greater<void>_>
           *__return_storage_ptr__,burst *this)

{
  anon_class_1_0_00000001 to_variant_range;
  tuple<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>
  common_ranges;
  vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
  local_1b0;
  iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>_>
  local_198;
  iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>
  local_168;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_118;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_f0;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_c8;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_a0;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_78;
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  local_50;
  
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = *(undefined4 *)this;
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = *(undefined4 *)(this + 4);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = *(undefined4 *)(this + 8);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = *(undefined4 *)(this + 0xc);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_iterator._M_current._0_4_ = *(undefined4 *)(this + 0x10);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin.m_iterator._M_current._4_4_ = *(undefined4 *)(this + 0x14);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_4_ = *(undefined4 *)(this + 0x18);
  local_198.
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End.m_container.
  super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._4_4_ = *(undefined4 *)(this + 0x1c);
  detail::
  by_all_impl<0ul,1ul,2ul,3ul,burst::detail::uniform_range_tuple_please_impl<std::forward_list<int,std::allocator<int>>const,std::__cxx11::list<int,std::allocator<int>>const,std::vector<int,std::allocator<int>>const,std::deque<int,std::allocator<int>>const>(std::tuple<std::forward_list<int,std::allocator<int>>const&,std::__cxx11::list<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::deque<int,std::allocator<int>>const&>,std::integral_constant<bool,false>)::_lambda(auto:1&)_1_const,std::tuple<std::forward_list<int,std::allocator<int>>const&,std::__cxx11::list<int,std::allocator<int>>const&,std::vector<int,std::allocator<int>>const&,std::deque<int,std::allocator<int>>const&>>
            (&local_168,(detail *)&local_1b0);
  make_range_vector_t::operator()
            (&local_1b0,(make_range_vector_t *)&make_range_vector,
             (iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>
              *)&local_78,
             (iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>
              *)&local_c8,
             (iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>
              *)&local_118,&local_168);
  own_as_range_t::operator()(&local_198,(own_as_range_t *)&own_as_range,&local_1b0);
  make_symmetric_difference_iterator<boost::iterator_range<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>,std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,std::_List_const_iterator<int>,__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::_Deque_iterator<int,int_const&,int_const*>>>>>>>,std::greater<void>>
            (__return_storage_ptr__,(burst *)&local_198);
  if (local_198.
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End.m_container.
      super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_End.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(local_198.
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._4_4_,
               local_198.
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
               .m_Begin.m_container.
               super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(local_198.
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
                        .
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
                        .
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                        .m_Begin.m_container.
                        super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._4_4_,
                        local_198.
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::random_access_traversal_tag>
                        .
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
                        .
                        super_iterator_range_base<burst::owning_iterator<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>_>,_boost::iterators::incrementable_traversal_tag>
                        .m_Begin.m_container.
                        super___shared_ptr<std::vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._0_4_));
  }
  std::
  vector<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>,_std::allocator<boost::iterator_range<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>_>_>_>
  ::~vector(&local_1b0);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_50);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_78);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_a0);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_c8);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_f0);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_118);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content(&local_168.
                     super_iterator_range_base<burst::variant_iterator<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>,_boost::iterators::incrementable_traversal_tag>
                     .m_End.m_iterator);
  boost::
  variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  ::destroy_content((variant<std::_Fwd_list_const_iterator<int>,_std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
                     *)&local_168);
  return __return_storage_ptr__;
}

Assistant:

auto make_symmetric_difference_iterator (std::tuple<Ranges &...> ranges, Compare compare)
    {
        auto common_ranges = detail::uniform_range_tuple_please(ranges);
        return
            make_symmetric_difference_iterator
            (
                burst::own_as_range(burst::apply(burst::make_range_vector, common_ranges)),
                std::move(compare)
            );
    }